

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_mem.c
# Opt level: O0

char * tnt_mem_dup(char *sz)

{
  size_t sVar1;
  char *szp;
  size_t len;
  char *sz_local;
  
  sVar1 = strlen(sz);
  sz_local = (char *)tnt_mem_alloc(sVar1 + 1);
  if (sz_local == (char *)0x0) {
    sz_local = (char *)0x0;
  }
  else {
    memcpy(sz_local,sz,sVar1 + 1);
  }
  return sz_local;
}

Assistant:

char *tnt_mem_dup(char *sz) {
	size_t len = strlen(sz);
	char *szp = tnt_mem_alloc(len + 1);
	if (szp == NULL)
		return NULL;
	memcpy(szp, sz, len + 1);
	return szp;
}